

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O3

void adj_abon(obj *otmp,schar delta)

{
  byte *pbVar1;
  
  if (otmp == (obj *)0x0) {
    return;
  }
  if ((uarmg == otmp) && (otmp->otyp == 0x92)) {
    if (delta != '\0') {
      discover_object((int)otmp->otyp,'\x01','\x01');
LAB_0018320d:
      if ((otmp->oprops & 0x100) != 0) {
        pbVar1 = (byte *)((long)&otmp->oprops_known + 1);
        *pbVar1 = *pbVar1 | 1;
      }
      u.abon.a[3] = u.abon.a[3] + delta;
    }
  }
  else {
    if ((otmp->oprops & 0x100) == 0) goto LAB_00183231;
    if (delta != '\0') goto LAB_0018320d;
  }
  iflags.botl = '\x01';
LAB_00183231:
  if ((uarmh == otmp) && (otmp->otyp == 0x51)) {
    if (delta == '\0') {
      iflags.botl = '\x01';
      return;
    }
    discover_object((int)otmp->otyp,'\x01','\x01');
  }
  else {
    if ((otmp->oprops & 0x200) == 0) {
      return;
    }
    if (delta == '\0') {
      iflags.botl = '\x01';
      return;
    }
  }
  if ((otmp->oprops & 0x200) != 0) {
    pbVar1 = (byte *)((long)&otmp->oprops_known + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  u.abon.a[2] = u.abon.a[2] + delta;
  u.abon.a[1] = u.abon.a[1] + delta;
  iflags.botl = '\x01';
  return;
}

Assistant:

void adj_abon(struct obj *otmp, schar delta)
{
	boolean isnormal;

	if (!otmp) return;

	isnormal = (uarmg == otmp && otmp->otyp == GAUNTLETS_OF_DEXTERITY);
	if (isnormal || (otmp->oprops & ITEM_DEXTERITY)) {
		if (delta) {
			if (isnormal)
				makeknown(otmp->otyp);
			if (otmp->oprops & ITEM_DEXTERITY)
				otmp->oprops_known |= ITEM_DEXTERITY;
			ABON(A_DEX) += (delta);
		}
		iflags.botl = 1;
	}

	isnormal = (uarmh == otmp && otmp->otyp == HELM_OF_BRILLIANCE);
	if (isnormal || (otmp->oprops & ITEM_BRILLIANCE)) {
		if (delta) {
			if (isnormal)
				makeknown(otmp->otyp);
			if (otmp->oprops & ITEM_BRILLIANCE)
				otmp->oprops_known |= ITEM_BRILLIANCE;
			ABON(A_INT) += (delta);
			ABON(A_WIS) += (delta);
		}
		iflags.botl = 1;
	}
}